

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O3

size_t __thiscall
trieste::wf::Choice::expected_distance_to_terminal
          (Choice *this,
          set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *omit,
          size_t max_distance,function<unsigned_long_(trieste::Token)> *distance)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  size_t sVar3;
  pointer pTVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  pointer pTVar7;
  Token local_38;
  
  pTVar4 = (this->types).super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl
           .super__Vector_impl_data._M_start;
  pTVar7 = (this->types).super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pTVar4 == pTVar7) {
    uVar6 = 0;
    pTVar7 = pTVar4;
  }
  else {
    p_Var1 = &(omit->_M_t)._M_impl.super__Rb_tree_header;
    uVar6 = 0;
    do {
      p_Var2 = (omit->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_38.def = pTVar4->def;
      p_Var5 = &p_Var1->_M_header;
      if (p_Var2 == (_Base_ptr)0x0) {
LAB_0018b8f6:
        if ((distance->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        sVar3 = (*distance->_M_invoker)((_Any_data *)distance,&local_38);
      }
      else {
        do {
          if (*(TokenDef **)(p_Var2 + 1) >= local_38.def) {
            p_Var5 = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(TokenDef **)(p_Var2 + 1) < local_38.def];
        } while (p_Var2 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
           (sVar3 = max_distance,
           local_38.def < (TokenDef *)((_Rb_tree_header *)p_Var5)->_M_node_count))
        goto LAB_0018b8f6;
      }
      uVar6 = uVar6 + sVar3;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar7);
    pTVar4 = (this->types).super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar7 = (this->types).super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return uVar6 / (ulong)((long)pTVar4 - (long)pTVar7 >> 3);
}

Assistant:

std::size_t expected_distance_to_terminal(
        const std::set<Token>& omit,
        std::size_t max_distance,
        std::function<std::size_t(Token)> distance) const
      {
        return std::accumulate(
                 types.begin(),
                 types.end(),
                 static_cast<std::size_t>(0),
                 [&](std::size_t acc, auto& type) {
                   if (omit.find(type) != omit.end())
                   {
                     return acc + max_distance;
                   }

                   return acc + distance(type);
                 }) /
          types.size();
      }